

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-haproxy.c
# Opt level: O3

CURLcode cf_haproxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  dynbuf *s;
  int *piVar1;
  CURLcode CVar2;
  size_t sVar3;
  ssize_t sVar4;
  char *pcVar5;
  char *pcVar6;
  _Bool _Var7;
  CURLcode result;
  CURLcode local_38;
  int local_34;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  piVar1 = (int *)cf->ctx;
  local_38 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (local_38 != CURLE_OK) {
    return local_38;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  CVar2 = CURLE_OK;
  if (*piVar1 == 1) {
LAB_0015119a:
    local_38 = CVar2;
    s = (dynbuf *)(piVar1 + 2);
    sVar3 = Curl_dyn_len(s);
    if (sVar3 == 0) {
LAB_001511f4:
      *piVar1 = 2;
      CVar2 = local_38;
      goto LAB_001511fb;
    }
    local_34 = cf->sockindex;
    pcVar6 = Curl_dyn_ptr(s);
    sVar4 = Curl_conn_send(data,local_34,pcVar6,sVar3,&local_38);
    if (sVar4 < 0) goto LAB_00151204;
    Curl_dyn_tail(s,sVar3 - sVar4);
    sVar3 = Curl_dyn_len(s);
    if (sVar3 == 0) goto LAB_001511f4;
  }
  else {
    if (*piVar1 == 0) {
      pcVar6 = (data->set).str[0x4d];
      pcVar5 = (data->info).conn_local_ip;
      if (pcVar6 != (char *)0x0) {
        pcVar5 = pcVar6;
      }
      pcVar6 = "TCP6";
      if (((uint)cf->conn->bits >> 0xc & 1) == 0) {
        pcVar6 = "TCP4";
      }
      _Var7 = false;
      local_38 = Curl_dyn_addf((dynbuf *)((long)cf->ctx + 8),"PROXY %s %s %s %i %i\r\n",pcVar6,
                               pcVar5,(data->info).conn_primary_ip,
                               (ulong)(uint)(data->info).conn_local_port,
                               (data->info).conn_primary_port);
      if (local_38 != CURLE_OK) goto LAB_00151230;
      *piVar1 = 1;
      CVar2 = local_38;
      goto LAB_0015119a;
    }
LAB_001511fb:
    local_38 = CVar2;
    Curl_dyn_free((dynbuf *)(piVar1 + 2));
LAB_00151204:
    if (local_38 != CURLE_OK) {
      _Var7 = false;
      goto LAB_00151230;
    }
  }
  _Var7 = *piVar1 == 2;
  local_38 = CURLE_OK;
LAB_00151230:
  *done = _Var7;
  cf->field_0x24 = cf->field_0x24 & 0xfe | _Var7;
  return local_38;
}

Assistant:

static CURLcode cf_haproxy_connect(struct Curl_cfilter *cf,
                                   struct Curl_easy *data,
                                   bool blocking, bool *done)
{
  struct cf_haproxy_ctx *ctx = cf->ctx;
  CURLcode result;
  size_t len;

  DEBUGASSERT(ctx);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  switch(ctx->state) {
  case HAPROXY_INIT:
    result = cf_haproxy_date_out_set(cf, data);
    if(result)
      goto out;
    ctx->state = HAPROXY_SEND;
    FALLTHROUGH();
  case HAPROXY_SEND:
    len = Curl_dyn_len(&ctx->data_out);
    if(len > 0) {
      ssize_t written = Curl_conn_send(data, cf->sockindex,
                                       Curl_dyn_ptr(&ctx->data_out),
                                       len, &result);
      if(written < 0)
        goto out;
      Curl_dyn_tail(&ctx->data_out, len - (size_t)written);
      if(Curl_dyn_len(&ctx->data_out) > 0) {
        result = CURLE_OK;
        goto out;
      }
    }
    ctx->state = HAPROXY_DONE;
    FALLTHROUGH();
  default:
    Curl_dyn_free(&ctx->data_out);
    break;
  }

out:
  *done = (!result) && (ctx->state == HAPROXY_DONE);
  cf->connected = *done;
  return result;
}